

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

int __thiscall
QCache<QtFontFallbacksCacheKey,_QList<QString>_>::remove
          (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *this,char *__filename)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  Node *__name;
  Node *n;
  Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  ulong uVar3;
  
  bVar1 = isEmpty(this);
  uVar3 = CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    __name = QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::
             findNode<QtFontFallbacksCacheKey>
                       (in_stack_ffffffffffffffe0,(QtFontFallbacksCacheKey *)this);
    if (__name == (Node *)0x0) {
      local_1 = 0;
      uVar3 = 0;
    }
    else {
      uVar2 = unlink(this,(char *)__name);
      uVar3 = (ulong)uVar2;
      local_1 = 1;
    }
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool remove(const Key &key) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        if (isEmpty())
            return false;
        Node *n = d.findNode(key);
        if (!n) {
            return false;
        } else {
            unlink(n);
            return true;
        }
    }